

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::save_resume_data(torrent *this,resume_data_flags_t flags)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  add_torrent_params atp;
  undefined1 auStack_3b8 [72];
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_368;
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    if (((flags.m_val & 0xf8) == 0) ||
       (((this->m_need_save_resume_data).m_val & flags.m_val & 0xf8) != 0)) {
      (this->m_need_save_resume_data).m_val = '\0';
      state_updated(this);
      if (((flags.m_val & 1) != 0) && ((this->m_storage).m_disk_io != (disk_interface *)0x0)) {
        iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[4])();
        auStack_3b8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        auStack_3b8._40_8_ = 0;
        auStack_3b8._48_8_ = (session_interface *)0x0;
        auStack_3b8._56_8_ = (pointer)0x0;
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
                  ((long *)CONCAT44(extraout_var,iVar3),(this->m_storage).m_idx.m_val);
        if ((session_interface *)auStack_3b8._48_8_ != (session_interface *)0x0) {
          (*(code *)auStack_3b8._48_8_)(auStack_3b8 + 0x20,auStack_3b8 + 0x20,3);
        }
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
      }
      state_updated(this);
      add_torrent_params::add_torrent_params((add_torrent_params *)&stack0xfffffffffffffc90);
      write_resume_data(this,flags,(add_torrent_params *)&stack0xfffffffffffffc90);
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)auStack_3b8);
      alert_manager::
      emplace_alert<libtorrent::save_resume_data_alert,libtorrent::add_torrent_params,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar3),
                 (add_torrent_params *)&stack0xfffffffffffffc90,(torrent_handle *)auStack_3b8);
      if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           )auStack_3b8._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2 = (_Atomic_word *)(auStack_3b8._8_8_ + 0xc);
          iVar3 = *p_Var2;
          *p_Var2 = *p_Var2 + -1;
          UNLOCK();
        }
        else {
          iVar3 = *(_Atomic_word *)(auStack_3b8._8_8_ + 0xc);
          *(int *)(auStack_3b8._8_8_ + 0xc) = iVar3 + -1;
        }
        if (iVar3 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)auStack_3b8._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
      add_torrent_params::~add_torrent_params((add_torrent_params *)&stack0xfffffffffffffc90);
      return;
    }
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xfffffffffffffc90);
    auStack_3b8._16_4_ = 0x8f;
    alert_manager::
    emplace_alert<libtorrent::save_resume_data_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
              ((alert_manager *)CONCAT44(extraout_var_02,iVar3),
               (torrent_handle *)&stack0xfffffffffffffc90,(error_code_enum *)(auStack_3b8 + 0x10));
  }
  else {
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xfffffffffffffc90);
    auStack_3b8._16_4_ = 0x50;
    alert_manager::
    emplace_alert<libtorrent::save_resume_data_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
              ((alert_manager *)CONCAT44(extraout_var_01,iVar3),
               (torrent_handle *)&stack0xfffffffffffffc90,(error_code_enum *)(auStack_3b8 + 0x10));
  }
  if (local_368._M_head_impl != (piece_picker *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)local_368._M_head_impl + 0xc);
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(int *)((long)local_368._M_head_impl + 0xc);
      *(int *)((long)local_368._M_head_impl + 0xc) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (**(code **)(*(long *)local_368._M_head_impl + 0x18))();
    }
  }
  return;
}

Assistant:

void torrent::save_resume_data(resume_data_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort)
		{
			alerts().emplace_alert<save_resume_data_failed_alert>(get_handle()
				, errors::torrent_removed);
			return;
		}

		auto conditions = flags & (
			torrent_handle::if_counters_changed
			| torrent_handle::if_download_progress
			| torrent_handle::if_config_changed
			| torrent_handle::if_state_changed
			| torrent_handle::if_metadata_changed
			);

		if (conditions && !(m_need_save_resume_data & conditions))
		{
			// if conditions were specified, but none of those conditions are
			// met (i.e. none of them have been updated since last
			// save_resume_data()), we don't save it.
			alerts().emplace_alert<save_resume_data_failed_alert>(get_handle()
				, errors::resume_data_not_modified);
			return;
		}

		m_need_save_resume_data = resume_data_flags_t{};
		state_updated();

		if ((flags & torrent_handle::flush_disk_cache) && m_storage)
		{
			m_ses.disk_thread().async_release_files(m_storage);
			m_ses.deferred_submit_jobs();
		}

		state_updated();

		add_torrent_params atp;
		write_resume_data(flags, atp);
		alerts().emplace_alert<save_resume_data_alert>(std::move(atp), get_handle());
	}